

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_lc.c
# Opt level: O0

double * MatMul(double *A,int Arow,int Acol,double *B,int Brow,int Bcol)

{
  double *pdVar1;
  int local_44;
  int local_40;
  int k;
  int j;
  int i;
  double *Out;
  int Bcol_local;
  int Brow_local;
  double *B_local;
  int Acol_local;
  int Arow_local;
  double *A_local;
  
  pdVar1 = (double *)malloc((long)Arow * 8 * (long)Bcol);
  if (Acol == Brow) {
    if (Acol == Brow) {
      for (k = 0; A_local = pdVar1, k < Arow; k = k + 1) {
        for (local_40 = 0; local_40 < Bcol; local_40 = local_40 + 1) {
          pdVar1[Bcol * k + local_40] = 0.0;
          for (local_44 = 0; local_44 < Acol; local_44 = local_44 + 1) {
            pdVar1[Bcol * k + local_40] =
                 A[Acol * k + local_44] * B[Bcol * local_44 + local_40] +
                 pdVar1[Bcol * k + local_40];
          }
        }
      }
    }
  }
  else {
    printf(anon_var_dwarf_15bf);
    A_local = (double *)0x0;
  }
  return A_local;
}

Assistant:

double *MatMul(double *A, int Arow, int Acol, double *B, int Brow, int Bcol) {
    double *Out = (double *) malloc(sizeof(double) * Arow * Bcol);
    if (Acol != Brow) {
        printf("        Shit!矩阵不可乘!\n");
        return NULL;
    }
    if (Acol == Brow) {
        int i, j, k;
        for (i = 0; i < Arow; i++)
            for (j = 0; j < Bcol; j++) {
                Out[Bcol * i + j] = 0;
                for (k = 0; k < Acol; k++)
                    Out[Bcol * i + j] = Out[Bcol * i + j] + A[Acol * i + k] * B[Bcol * k + j];
            }
        return Out;
    }
}